

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::SyncTransaction
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool update_tx,
          bool rescanning_old_block)

{
  long lVar1;
  bool bVar2;
  CTransactionRef *in_RDX;
  CWallet *in_RSI;
  long in_FS_OFFSET;
  bool in_stack_000000ee;
  bool in_stack_000000ef;
  SyncTxState *in_stack_000000f0;
  CTransactionRef *in_stack_000000f8;
  CWallet *in_stack_00000100;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = AddToWalletIfInvolvingMe
                    (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000ef,
                     in_stack_000000ee);
  if (bVar2) {
    MarkInputsDirty(in_RSI,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::SyncTransaction(const CTransactionRef& ptx, const SyncTxState& state, bool update_tx, bool rescanning_old_block)
{
    if (!AddToWalletIfInvolvingMe(ptx, state, update_tx, rescanning_old_block))
        return; // Not one of ours

    // If a transaction changes 'conflicted' state, that changes the balance
    // available of the outputs it spends. So force those to be
    // recomputed, also:
    MarkInputsDirty(ptx);
}